

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O3

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,t2<char,_int> *Val)

{
  ulong uVar1;
  byte in_AL;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  if (NArgs < 4) {
    bVar6 = false;
  }
  else {
    iVar2 = strncmp(Args[1],Opt,0x20);
    if (iVar2 == 0) {
      uVar3 = 3;
      bVar6 = true;
      lVar5 = 1;
    }
    else {
      uVar1 = 4;
      do {
        uVar3 = uVar1;
        if (uVar3 + (2 - (ulong)(NArgs - 2)) == 4) {
          bVar6 = uVar3 < (uint)NArgs;
          in_AL = 4;
          goto LAB_0010412f;
        }
        iVar2 = strncmp(Args[uVar3 - 2],Opt,0x20);
        uVar1 = uVar3 + 1;
      } while (iVar2 != 0);
      bVar6 = uVar3 < (uint)NArgs;
      lVar5 = uVar3 - 2;
    }
    Val->First = *Args[lVar5 + 1];
    local_40 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + uVar3))->Ptr;
    sVar4 = strlen(local_40.Ptr);
    local_38 = (undefined4)sVar4;
    in_AL = ToInt((stref *)&local_40,&Val->Second);
  }
LAB_0010412f:
  return (bool)(bVar6 & in_AL);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, t2<char, int>* Val)
{
  for (int I = 1; I + 2 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      Val->First = Args[I + 1][0];
      return ToInt(Args[I + 2], &Val->Second);
    }
  }

  return false;
}